

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall CSlidingBucket::createbucket(CSlidingBucket *this,int bucketindex)

{
  int iVar1;
  uint uVar2;
  AbstractSearchState ***pppAVar3;
  int eind;
  AbstractSearchState **ppAVar4;
  long lVar5;
  ulong uVar6;
  SBPL_Exception *this_00;
  ulong uVar7;
  
  pppAVar3 = this->bucketV;
  if (pppAVar3[bucketindex] == (AbstractSearchState **)0x0) {
    iVar1 = this->initialdynamicsize;
    if ((long)iVar1 == 0) {
      uVar2 = this->bucketsize;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (long)(int)uVar2) {
        uVar6 = (long)(int)uVar2 * 8;
      }
      ppAVar4 = (AbstractSearchState **)operator_new__(uVar6);
      pppAVar3[bucketindex] = ppAVar4;
      uVar6 = 0;
      uVar7 = 0;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        this->bucketV[bucketindex][uVar6] = (AbstractSearchState *)0x0;
      }
    }
    else {
      this->dynamicsize[bucketindex] = iVar1;
      ppAVar4 = (AbstractSearchState **)malloc((long)iVar1 << 3);
      pppAVar3[bucketindex] = ppAVar4;
      for (lVar5 = 0; lVar5 < this->dynamicsize[bucketindex]; lVar5 = lVar5 + 1) {
        this->bucketV[bucketindex][lVar5] = (AbstractSearchState *)0x0;
      }
    }
    return;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(this_00,"ERROR: trying to create a non-null bucket");
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createbucket(int bucketindex)
    {
        if (bucketV[bucketindex] != NULL) {
            throw SBPL_Exception("ERROR: trying to create a non-null bucket");
        }

        if(initialdynamicsize)
        {
            dynamicsize[bucketindex] = initialdynamicsize;
            bucketV[bucketindex] = (AbstractSearchState**) malloc(sizeof(AbstractSearchState*) *  dynamicsize[bucketindex] );
            for (int eind = 0; eind < dynamicsize[bucketindex]; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
        else
        {
            bucketV[bucketindex] = new AbstractSearchState*[bucketsize];
            for (int eind = 0; eind < bucketsize; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
    }